

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int intEventCallback(int pi,uint event,void *f,void *user,int ex)

{
  int iVar1;
  evtCallback_t *peVar2;
  
  iVar1 = -0x7d8;
  peVar2 = geCallBackFirst;
  if (f != (void *)0x0 && event < 0x20) {
    for (; peVar2 != (evtCallback_t *)0x0; peVar2 = peVar2->next) {
      if (((peVar2->pi == pi) && (peVar2->event == event)) && (peVar2->f == (CBF_t)f)) {
        return -0x7d6;
      }
    }
    peVar2 = (evtCallback_t *)malloc(0x38);
    if (peVar2 == (evtCallback_t *)0x0) {
      iVar1 = -0x7d7;
    }
    else {
      if (geCallBackFirst == (evtCallback_t *)0x0) {
        geCallBackFirst = peVar2;
      }
      iVar1 = intEventCallback::id + 1;
      peVar2->id = intEventCallback::id;
      intEventCallback::id = iVar1;
      peVar2->pi = pi;
      peVar2->event = event;
      peVar2->f = (CBF_t)f;
      peVar2->user = user;
      peVar2->ex = ex;
      peVar2->next = (evtCallback_t *)0x0;
      peVar2->prev = geCallBackLast;
      if (geCallBackLast != (evtCallback_t *)0x0) {
        geCallBackLast->next = peVar2;
      }
      geCallBackLast = peVar2;
      findEventBits(pi);
      iVar1 = peVar2->id;
    }
  }
  return iVar1;
}

Assistant:

static int intEventCallback(
   int pi, unsigned event, void *f, void *user, int ex)
{
   static int id = 0;
   evtCallback_t *ep;

   if ((event >=0) && (event < 32) && f)
   {
      /* prevent duplicates */

      ep = geCallBackFirst;

      while (ep)
      {
         if ((ep->pi    == pi)    &&
             (ep->event == event) &&
             (ep->f     == f))
         {
            return pigif_duplicate_callback;
         }
         ep = ep->next;
      }

      ep = malloc(sizeof(evtCallback_t));

      if (ep)
      {
         if (!geCallBackFirst) geCallBackFirst = ep;

         ep->id = id++;
         ep->pi = pi;
         ep->event = event;
         ep->f = f;
         ep->user = user;
         ep->ex = ex;
         ep->next = 0;
         ep->prev = geCallBackLast;

         if (ep->prev) (ep->prev)->next = ep;
         geCallBackLast = ep;

         findEventBits(pi);

         return ep->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}